

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_setting_fx_spot_stream_with_non_default_account_Test::
~SubjectFactoryTest_test_setting_fx_spot_stream_with_non_default_account_Test
          (SubjectFactoryTest_test_setting_fx_spot_stream_with_non_default_account_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_fx_spot_stream_with_non_default_account)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=METALS_ACC1,Currency=XAU,DealType=Spot,Level=1,LiquidityProvider=RBSFX,Quantity=23000.00,RequestFor=Stream,Symbol=XAUUSD,Tenor=Spot,User=fbennett",
            subject_factory.Fx().Stream().Spot()
                    .BuySideAccount("METALS_ACC1")
                    .CurrencyPair("XAUUSD")
                    .Currency("XAU")
                    .Quantity(23000)
                    .LiquidityProvider("RBSFX")
                    .CreateSubject()
                    .ToString().c_str());
}